

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_do_toggle(nk_flags *state,nk_command_buffer *out,nk_rect r,int *active,char *str,int len,
                nk_toggle_type type,nk_style_toggle *style,nk_input *in,nk_user_font *font)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  nk_image *img;
  nk_style_item *pnVar5;
  nk_style_toggle *pnVar6;
  float fVar7;
  float fVar8;
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  float fVar9;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  nk_rect r_00;
  nk_rect r_01;
  nk_rect r_02;
  nk_rect r_03;
  nk_rect r_04;
  nk_rect r_05;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect r_06;
  nk_rect rect_01;
  nk_rect b;
  undefined8 local_138;
  float local_118;
  float fStack_114;
  nk_text local_108;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  undefined4 uStack_ec;
  float local_e8;
  float fStack_e4;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  char *local_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_e8 = r.x;
  fStack_f4 = r.y;
  if (style == (nk_style_toggle *)0x0) {
    __assert_fail("style",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x4f13,
                  "int nk_do_toggle(nk_flags *, struct nk_command_buffer *, struct nk_rect, int *, const char *, int, enum nk_toggle_type, const struct nk_style_toggle *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (out == (nk_command_buffer *)0x0) {
    __assert_fail("out",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x4f14,
                  "int nk_do_toggle(nk_flags *, struct nk_command_buffer *, struct nk_rect, int *, const char *, int, enum nk_toggle_type, const struct nk_style_toggle *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (font == (nk_user_font *)0x0) {
    __assert_fail("font",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x4f15,
                  "int nk_do_toggle(nk_flags *, struct nk_command_buffer *, struct nk_rect, int *, const char *, int, enum nk_toggle_type, const struct nk_style_toggle *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (active == (int *)0x0) goto LAB_00137c69;
  local_d8 = font->height;
  fVar1 = style->border;
  local_78 = fVar1 + fVar1;
  fVar10 = (style->touch_padding).x;
  fVar8 = (style->touch_padding).y;
  local_88 = local_e8 - fVar10;
  fStack_84 = fStack_f4 - fVar8;
  fStack_80 = in_XMM0_Dc - 0.0;
  fStack_7c = in_XMM0_Dd - 0.0;
  local_118 = (style->padding).x;
  fStack_114 = (style->padding).y;
  local_c8 = local_118 + local_118;
  fStack_c4 = fStack_114 + fStack_114;
  fStack_c0 = 0.0;
  fStack_bc = 0.0;
  auVar11._0_4_ = local_c8 + local_d8;
  auVar11._4_4_ = fStack_c4 + local_d8;
  auVar11._8_4_ = local_d8 + 0.0;
  auVar11._12_4_ = local_d8 + 0.0;
  auVar12._8_4_ = in_XMM1_Dc;
  auVar12._0_8_ = r._8_8_;
  auVar12._12_4_ = in_XMM1_Dd;
  auVar12 = maxps(auVar11,auVar12);
  local_98 = fVar10 + fVar10 + auVar12._0_4_;
  fStack_64 = auVar12._4_4_;
  fStack_94 = fVar8 + fVar8 + fStack_64;
  fStack_90 = auVar12._8_4_ + 0.0;
  fStack_8c = auVar12._12_4_ + 0.0;
  fStack_e4 = (fStack_64 * 0.5 + fStack_f4) - local_d8 * 0.5;
  local_58 = ZEXT416((uint)local_d8);
  local_b8 = local_e8 + local_d8 + style->spacing;
  local_48._8_4_ = in_XMM0_Dc;
  local_48._0_8_ = r._0_8_;
  local_48._12_4_ = in_XMM0_Dd;
  fVar10 = auVar12._0_4_ + local_e8;
  local_f8 = local_b8;
  if (local_b8 <= fVar10) {
    local_f8 = fVar10;
  }
  uVar4 = *active;
  *state = *state & 2 | 4;
  r_00.y = fStack_84;
  r_00.x = local_88;
  r_00.h = fStack_94;
  r_00.w = local_98;
  fStack_d4 = local_d8;
  fStack_d0 = local_d8;
  fStack_cc = local_d8;
  fStack_b4 = fStack_f4;
  local_a0 = str;
  fStack_74 = local_78;
  fStack_70 = local_78;
  fStack_6c = local_78;
  local_68 = fStack_e4;
  fStack_60 = fStack_64;
  fStack_5c = fStack_64;
  iVar2 = nk_button_behavior(state,r_00,in,NK_BUTTON_DEFAULT);
  if (iVar2 == 0) {
    uVar3 = *state;
    if ((uVar3 & 0x10) == 0) goto LAB_00137833;
    if ((((in != (nk_input *)0x0) && (fVar10 = (in->mouse).prev.x, local_88 <= fVar10)) &&
        (fVar10 < local_88 + local_98)) &&
       ((fVar8 = (in->mouse).prev.y, fStack_84 <= fVar8 && (fVar8 < fStack_84 + fStack_94))))
    goto LAB_0013786f;
    uVar3 = uVar3 | 8;
LAB_00137940:
    *state = uVar3;
  }
  else {
    *state = 0x22;
    uVar3 = 0x22;
    uVar4 = (uint)(uVar4 == 0);
LAB_00137833:
    if (in != (nk_input *)0x0) {
      fVar10 = (in->mouse).prev.x;
LAB_0013786f:
      if (((local_88 <= fVar10) && (fVar10 < local_88 + local_98)) &&
         ((fVar10 = (in->mouse).prev.y, fStack_84 <= fVar10 && (fVar10 < fStack_84 + fStack_94)))) {
        uVar3 = uVar3 | 0x40;
        goto LAB_00137940;
      }
    }
  }
  local_118 = local_118 + local_e8;
  fStack_114 = fStack_114 + fStack_e4;
  local_f8 = local_f8 - local_b8;
  *active = uVar4;
  fVar10 = local_c8 + local_78;
  fVar8 = fStack_c4 + fStack_74;
  if (style->draw_begin != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
    local_c8 = local_c8 + local_78;
    fStack_c4 = fStack_c4 + fStack_74;
    fStack_c0 = fStack_c0 + fStack_70;
    fStack_bc = fStack_bc + fStack_6c;
    (*style->draw_begin)(out,(nk_handle)(style->userdata).ptr);
    fVar10 = local_c8;
    fVar8 = fStack_c4;
  }
  fStack_b0 = fStack_b4;
  fStack_f0 = fStack_f4;
  local_118 = local_118 + fVar1;
  fStack_114 = fStack_114 + fVar1;
  fVar10 = local_d8 - fVar10;
  fVar8 = fStack_d4 - fVar8;
  fStack_b4 = local_68;
  fStack_ac = fStack_64;
  fStack_f4 = (float)local_58._0_4_;
  uStack_ec = local_58._4_4_;
  uVar4 = *state;
  iVar2 = *active;
  if (type == NK_TOGGLE_CHECK) {
    if ((uVar4 & 0x10) == 0) {
      if ((uVar4 & 0x20) != 0) {
        local_108.text = style->text_active;
        goto LAB_00137b3b;
      }
      pnVar5 = &style->cursor_normal;
      local_108.text = style->text_normal;
      pnVar6 = style;
    }
    else {
      local_108.text = style->text_hover;
LAB_00137b3b:
      pnVar6 = (nk_style_toggle *)&style->hover;
      pnVar5 = &style->cursor_hover;
    }
    if ((pnVar6->normal).type == NK_STYLE_ITEM_COLOR) {
      rect.y = fStack_e4;
      rect.x = local_e8;
      rect.h = fStack_d4;
      rect.w = local_d8;
      nk_fill_rect(out,rect,0.0,style->border_color);
      fVar1 = style->border;
      fVar7 = fVar1 + fVar1;
      fVar9 = fVar7;
      if (fVar7 <= (float)local_58._0_4_) {
        fVar9 = (float)local_58._0_4_;
      }
      rect_00.w = fVar9 - fVar7;
      rect_00.y = local_68 + fVar1;
      rect_00.x = (float)local_48._0_4_ + fVar1;
      rect_00.h = rect_00.w;
      nk_fill_rect(out,rect_00,0.0,(pnVar6->normal).data.color);
    }
    else {
      r_05.y = fStack_e4;
      r_05.x = local_e8;
      r_05.h = fStack_d4;
      r_05.w = local_d8;
      nk_draw_image(out,r_05,&(pnVar6->normal).data.image,(nk_color)0xffffffff);
    }
    if (iVar2 != 0) {
      img = (nk_image *)&pnVar5->data;
      if (pnVar5->type == NK_STYLE_ITEM_IMAGE) goto LAB_00137be4;
      rect_01.y = fStack_114;
      rect_01.x = local_118;
      rect_01.w = fVar10;
      rect_01.h = fVar8;
      nk_fill_rect(out,rect_01,0.0,*(nk_color *)img);
    }
  }
  else {
    if ((uVar4 & 0x10) == 0) {
      if ((uVar4 & 0x20) != 0) {
        local_108.text = style->text_active;
        goto LAB_00137a69;
      }
      pnVar5 = &style->cursor_normal;
      local_108.text = style->text_normal;
      pnVar6 = style;
    }
    else {
      local_108.text = style->text_hover;
LAB_00137a69:
      pnVar6 = (nk_style_toggle *)&style->hover;
      pnVar5 = &style->cursor_hover;
    }
    if ((pnVar6->normal).type == NK_STYLE_ITEM_COLOR) {
      r_02.y = fStack_e4;
      r_02.x = local_e8;
      r_02.h = fStack_d4;
      r_02.w = local_d8;
      nk_fill_circle(out,r_02,style->border_color);
      fVar1 = style->border;
      fVar7 = fVar1 + fVar1;
      fVar9 = fVar7;
      if (fVar7 <= (float)local_58._0_4_) {
        fVar9 = (float)local_58._0_4_;
      }
      r_03.w = fVar9 - fVar7;
      r_03.y = local_68 + fVar1;
      r_03.x = (float)local_48._0_4_ + fVar1;
      r_03.h = r_03.w;
      nk_fill_circle(out,r_03,(pnVar6->normal).data.color);
    }
    else {
      r_01.y = fStack_e4;
      r_01.x = local_e8;
      r_01.h = fStack_d4;
      r_01.w = local_d8;
      nk_draw_image(out,r_01,&(pnVar6->normal).data.image,(nk_color)0xffffffff);
    }
    r_04.y = fStack_114;
    r_04.x = local_118;
    if (iVar2 != 0) {
      img = (nk_image *)&pnVar5->data;
      if (pnVar5->type == NK_STYLE_ITEM_IMAGE) {
LAB_00137be4:
        r_06.y = fStack_114;
        r_06.x = local_118;
        r_06.w = fVar10;
        r_06.h = fVar8;
        nk_draw_image(out,r_06,img,(nk_color)0xffffffff);
      }
      else {
        r_04.w = fVar10;
        r_04.h = fVar8;
        nk_fill_circle(out,r_04,*(nk_color *)img);
      }
    }
  }
  local_108.padding.x = 0.0;
  local_108.padding.y = 0.0;
  local_108.background = style->text_background;
  b.y = fStack_b4;
  b.x = local_b8;
  b.h = fStack_f4;
  b.w = local_f8;
  nk_widget_text(out,b,local_a0,len,&local_108,0x11,font);
  font = (nk_user_font *)style->draw_end;
  if (font != (nk_user_font *)0x0) {
    font = (nk_user_font *)(*(code *)font)(out,(style->userdata).ptr);
  }
LAB_00137c69:
  return (int)font;
}

Assistant:

NK_LIB int
nk_do_toggle(nk_flags *state,
    struct nk_command_buffer *out, struct nk_rect r,
    int *active, const char *str, int len, enum nk_toggle_type type,
    const struct nk_style_toggle *style, const struct nk_input *in,
    const struct nk_user_font *font)
{
    int was_active;
    struct nk_rect bounds;
    struct nk_rect select;
    struct nk_rect cursor;
    struct nk_rect label;

    NK_ASSERT(style);
    NK_ASSERT(out);
    NK_ASSERT(font);
    if (!out || !style || !font || !active)
        return 0;

    r.w = NK_MAX(r.w, font->height + 2 * style->padding.x);
    r.h = NK_MAX(r.h, font->height + 2 * style->padding.y);

    /* add additional touch padding for touch screen devices */
    bounds.x = r.x - style->touch_padding.x;
    bounds.y = r.y - style->touch_padding.y;
    bounds.w = r.w + 2 * style->touch_padding.x;
    bounds.h = r.h + 2 * style->touch_padding.y;

    /* calculate the selector space */
    select.w = font->height;
    select.h = select.w;
    select.y = r.y + r.h/2.0f - select.h/2.0f;
    select.x = r.x;

    /* calculate the bounds of the cursor inside the selector */
    cursor.x = select.x + style->padding.x + style->border;
    cursor.y = select.y + style->padding.y + style->border;
    cursor.w = select.w - (2 * style->padding.x + 2 * style->border);
    cursor.h = select.h - (2 * style->padding.y + 2 * style->border);

    /* label behind the selector */
    label.x = select.x + select.w + style->spacing;
    label.y = select.y;
    label.w = NK_MAX(r.x + r.w, label.x) - label.x;
    label.h = select.w;

    /* update selector */
    was_active = *active;
    *active = nk_toggle_behavior(in, bounds, state, *active);

    /* draw selector */
    if (style->draw_begin)
        style->draw_begin(out, style->userdata);
    if (type == NK_TOGGLE_CHECK) {
        nk_draw_checkbox(out, *state, style, *active, &label, &select, &cursor, str, len, font);
    } else {
        nk_draw_option(out, *state, style, *active, &label, &select, &cursor, str, len, font);
    }
    if (style->draw_end)
        style->draw_end(out, style->userdata);
    return (was_active != *active);
}